

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_sse2.c
# Opt level: O1

void HorizontalFilter_SSE2(uint8_t *data,int width,int height,int stride,uint8_t *filtered_data)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  uint8_t uVar19;
  uint8_t uVar20;
  uint8_t uVar21;
  uint8_t uVar22;
  uint8_t uVar23;
  uint8_t uVar24;
  uint8_t uVar25;
  uint8_t uVar26;
  uint8_t uVar27;
  uint8_t uVar28;
  uint8_t uVar29;
  uint8_t uVar30;
  uint8_t uVar31;
  uint8_t uVar32;
  uint8_t uVar33;
  uint8_t uVar34;
  uint8_t uVar35;
  uint8_t uVar36;
  uint8_t uVar37;
  uint8_t uVar38;
  uint8_t uVar39;
  uint8_t uVar40;
  uint8_t uVar41;
  uint8_t uVar42;
  uint8_t uVar43;
  uint8_t uVar44;
  uint8_t uVar45;
  uint8_t uVar46;
  uint8_t uVar47;
  uint8_t uVar48;
  uint8_t uVar49;
  uint8_t uVar50;
  uint8_t uVar51;
  uint8_t uVar52;
  uint8_t uVar53;
  uint8_t uVar54;
  uint8_t uVar55;
  uint8_t uVar56;
  uint8_t uVar57;
  uint8_t uVar58;
  uint8_t uVar59;
  uint8_t uVar60;
  uint8_t uVar61;
  uint8_t uVar62;
  uint8_t uVar63;
  uint8_t uVar64;
  uint8_t uVar65;
  long lVar66;
  uint uVar67;
  uint8_t *puVar68;
  int iVar69;
  uint uVar70;
  ulong uVar71;
  uint8_t *puVar72;
  uint8_t *puVar73;
  uint8_t *puVar74;
  
  *filtered_data = *data;
  uVar70 = width - 1;
  uVar67 = uVar70 & 0xffffffe0;
  if ((int)uVar67 < 1) {
    uVar71 = 0;
  }
  else {
    uVar71 = 0;
    do {
      puVar68 = data + uVar71;
      uVar4 = puVar68[1];
      uVar5 = puVar68[2];
      uVar6 = puVar68[3];
      uVar7 = puVar68[4];
      uVar8 = puVar68[5];
      uVar9 = puVar68[6];
      uVar10 = puVar68[7];
      uVar11 = puVar68[8];
      uVar12 = puVar68[9];
      uVar13 = puVar68[10];
      uVar14 = puVar68[0xb];
      uVar15 = puVar68[0xc];
      uVar16 = puVar68[0xd];
      uVar17 = puVar68[0xe];
      uVar18 = puVar68[0xf];
      puVar72 = data + uVar71 + 1;
      uVar19 = puVar72[1];
      uVar20 = puVar72[2];
      uVar21 = puVar72[3];
      uVar22 = puVar72[4];
      uVar23 = puVar72[5];
      uVar24 = puVar72[6];
      uVar25 = puVar72[7];
      uVar26 = puVar72[8];
      uVar27 = puVar72[9];
      uVar28 = puVar72[10];
      uVar29 = puVar72[0xb];
      uVar30 = puVar72[0xc];
      uVar31 = puVar72[0xd];
      uVar32 = puVar72[0xe];
      uVar33 = puVar72[0xf];
      puVar73 = data + uVar71 + 0x10;
      uVar34 = *puVar73;
      uVar35 = puVar73[1];
      uVar36 = puVar73[2];
      uVar37 = puVar73[3];
      uVar38 = puVar73[4];
      uVar39 = puVar73[5];
      uVar40 = puVar73[6];
      uVar41 = puVar73[7];
      uVar42 = puVar73[8];
      uVar43 = puVar73[9];
      uVar44 = puVar73[10];
      uVar45 = puVar73[0xb];
      uVar46 = puVar73[0xc];
      uVar47 = puVar73[0xd];
      uVar48 = puVar73[0xe];
      uVar49 = puVar73[0xf];
      puVar73 = data + uVar71 + 0x11;
      uVar50 = *puVar73;
      uVar51 = puVar73[1];
      uVar52 = puVar73[2];
      uVar53 = puVar73[3];
      uVar54 = puVar73[4];
      uVar55 = puVar73[5];
      uVar56 = puVar73[6];
      uVar57 = puVar73[7];
      uVar58 = puVar73[8];
      uVar59 = puVar73[9];
      uVar60 = puVar73[10];
      uVar61 = puVar73[0xb];
      uVar62 = puVar73[0xc];
      uVar63 = puVar73[0xd];
      uVar64 = puVar73[0xe];
      uVar65 = puVar73[0xf];
      puVar73 = filtered_data + uVar71 + 1;
      *puVar73 = *puVar72 - *puVar68;
      puVar73[1] = uVar19 - uVar4;
      puVar73[2] = uVar20 - uVar5;
      puVar73[3] = uVar21 - uVar6;
      puVar73[4] = uVar22 - uVar7;
      puVar73[5] = uVar23 - uVar8;
      puVar73[6] = uVar24 - uVar9;
      puVar73[7] = uVar25 - uVar10;
      puVar73[8] = uVar26 - uVar11;
      puVar73[9] = uVar27 - uVar12;
      puVar73[10] = uVar28 - uVar13;
      puVar73[0xb] = uVar29 - uVar14;
      puVar73[0xc] = uVar30 - uVar15;
      puVar73[0xd] = uVar31 - uVar16;
      puVar73[0xe] = uVar32 - uVar17;
      puVar73[0xf] = uVar33 - uVar18;
      puVar68 = filtered_data + uVar71 + 0x11;
      *puVar68 = uVar50 - uVar34;
      puVar68[1] = uVar51 - uVar35;
      puVar68[2] = uVar52 - uVar36;
      puVar68[3] = uVar53 - uVar37;
      puVar68[4] = uVar54 - uVar38;
      puVar68[5] = uVar55 - uVar39;
      puVar68[6] = uVar56 - uVar40;
      puVar68[7] = uVar57 - uVar41;
      puVar68[8] = uVar58 - uVar42;
      puVar68[9] = uVar59 - uVar43;
      puVar68[10] = uVar60 - uVar44;
      puVar68[0xb] = uVar61 - uVar45;
      puVar68[0xc] = uVar62 - uVar46;
      puVar68[0xd] = uVar63 - uVar47;
      puVar68[0xe] = uVar64 - uVar48;
      puVar68[0xf] = uVar65 - uVar49;
      uVar71 = uVar71 + 0x20;
    } while (uVar71 < uVar67);
  }
  if ((int)uVar71 < (int)uVar70) {
    uVar71 = uVar71 & 0xffffffff;
    do {
      filtered_data[uVar71 + 1] = data[uVar71 + 1] - data[uVar71];
      uVar71 = uVar71 + 1;
    } while (uVar70 != uVar71);
  }
  if (1 < height) {
    lVar66 = (long)stride;
    puVar68 = filtered_data + lVar66 + 0x11;
    puVar73 = data + lVar66 + 0x11;
    puVar74 = filtered_data + lVar66 + 1;
    puVar72 = data + lVar66 + 1;
    iVar69 = 1;
    do {
      puVar1 = data + lVar66;
      data = data + lVar66;
      filtered_data[lVar66] = *puVar1 - data[-lVar66];
      uVar71 = 0;
      if (0 < (int)uVar67) {
        uVar71 = 0;
        do {
          puVar2 = puVar73 + (uVar71 - 0x11);
          uVar4 = puVar2[1];
          uVar5 = puVar2[2];
          uVar6 = puVar2[3];
          uVar7 = puVar2[4];
          uVar8 = puVar2[5];
          uVar9 = puVar2[6];
          uVar10 = puVar2[7];
          uVar11 = puVar2[8];
          uVar12 = puVar2[9];
          uVar13 = puVar2[10];
          uVar14 = puVar2[0xb];
          uVar15 = puVar2[0xc];
          uVar16 = puVar2[0xd];
          uVar17 = puVar2[0xe];
          uVar18 = puVar2[0xf];
          puVar3 = puVar73 + (uVar71 - 0x10);
          uVar19 = puVar3[1];
          uVar20 = puVar3[2];
          uVar21 = puVar3[3];
          uVar22 = puVar3[4];
          uVar23 = puVar3[5];
          uVar24 = puVar3[6];
          uVar25 = puVar3[7];
          uVar26 = puVar3[8];
          uVar27 = puVar3[9];
          uVar28 = puVar3[10];
          uVar29 = puVar3[0xb];
          uVar30 = puVar3[0xc];
          uVar31 = puVar3[0xd];
          uVar32 = puVar3[0xe];
          uVar33 = puVar3[0xf];
          puVar1 = puVar73 + (uVar71 - 1);
          uVar34 = *puVar1;
          uVar35 = puVar1[1];
          uVar36 = puVar1[2];
          uVar37 = puVar1[3];
          uVar38 = puVar1[4];
          uVar39 = puVar1[5];
          uVar40 = puVar1[6];
          uVar41 = puVar1[7];
          uVar42 = puVar1[8];
          uVar43 = puVar1[9];
          uVar44 = puVar1[10];
          uVar45 = puVar1[0xb];
          uVar46 = puVar1[0xc];
          uVar47 = puVar1[0xd];
          uVar48 = puVar1[0xe];
          uVar49 = puVar1[0xf];
          puVar1 = puVar73 + uVar71;
          uVar50 = *puVar1;
          uVar51 = puVar1[1];
          uVar52 = puVar1[2];
          uVar53 = puVar1[3];
          uVar54 = puVar1[4];
          uVar55 = puVar1[5];
          uVar56 = puVar1[6];
          uVar57 = puVar1[7];
          uVar58 = puVar1[8];
          uVar59 = puVar1[9];
          uVar60 = puVar1[10];
          uVar61 = puVar1[0xb];
          uVar62 = puVar1[0xc];
          uVar63 = puVar1[0xd];
          uVar64 = puVar1[0xe];
          uVar65 = puVar1[0xf];
          puVar1 = puVar68 + (uVar71 - 0x10);
          *puVar1 = *puVar3 - *puVar2;
          puVar1[1] = uVar19 - uVar4;
          puVar1[2] = uVar20 - uVar5;
          puVar1[3] = uVar21 - uVar6;
          puVar1[4] = uVar22 - uVar7;
          puVar1[5] = uVar23 - uVar8;
          puVar1[6] = uVar24 - uVar9;
          puVar1[7] = uVar25 - uVar10;
          puVar1[8] = uVar26 - uVar11;
          puVar1[9] = uVar27 - uVar12;
          puVar1[10] = uVar28 - uVar13;
          puVar1[0xb] = uVar29 - uVar14;
          puVar1[0xc] = uVar30 - uVar15;
          puVar1[0xd] = uVar31 - uVar16;
          puVar1[0xe] = uVar32 - uVar17;
          puVar1[0xf] = uVar33 - uVar18;
          puVar1 = puVar68 + uVar71;
          *puVar1 = uVar50 - uVar34;
          puVar1[1] = uVar51 - uVar35;
          puVar1[2] = uVar52 - uVar36;
          puVar1[3] = uVar53 - uVar37;
          puVar1[4] = uVar54 - uVar38;
          puVar1[5] = uVar55 - uVar39;
          puVar1[6] = uVar56 - uVar40;
          puVar1[7] = uVar57 - uVar41;
          puVar1[8] = uVar58 - uVar42;
          puVar1[9] = uVar59 - uVar43;
          puVar1[10] = uVar60 - uVar44;
          puVar1[0xb] = uVar61 - uVar45;
          puVar1[0xc] = uVar62 - uVar46;
          puVar1[0xd] = uVar63 - uVar47;
          puVar1[0xe] = uVar64 - uVar48;
          puVar1[0xf] = uVar65 - uVar49;
          uVar71 = uVar71 + 0x20;
        } while (uVar71 < uVar67);
      }
      if ((int)uVar71 < (int)uVar70) {
        uVar71 = uVar71 & 0xffffffff;
        do {
          puVar74[uVar71] = puVar72[uVar71] - puVar72[uVar71 - 1];
          uVar71 = uVar71 + 1;
        } while (uVar70 != uVar71);
      }
      filtered_data = filtered_data + lVar66;
      iVar69 = iVar69 + 1;
      puVar68 = puVar68 + lVar66;
      puVar73 = puVar73 + lVar66;
      puVar74 = puVar74 + lVar66;
      puVar72 = puVar72 + lVar66;
    } while (iVar69 != height);
  }
  return;
}

Assistant:

static void HorizontalFilter_SSE2(const uint8_t* WEBP_RESTRICT data,
                                  int width, int height, int stride,
                                  uint8_t* WEBP_RESTRICT filtered_data) {
  DoHorizontalFilter_SSE2(data, width, height, stride, filtered_data);
}